

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

void prvTidyCheckHTML5(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  int iVar2;
  Dict *pDVar3;
  bool bVar4;
  Bool BVar5;
  Node *pNVar6;
  AttVal *pAVar7;
  long lVar8;
  TidyTagId TVar9;
  char *property;
  
  iVar1 = *(int *)((doc->config).value + 0x30);
  iVar2 = *(int *)((doc->config).value + 0x51);
  pNVar6 = prvTidyFindBody(doc);
  if (node != (Node *)0x0) {
    do {
      for (pAVar7 = node->attributes; bVar4 = iVar2 != 0, pAVar7 != (AttVal *)0x0;
          pAVar7 = pAVar7->next) {
        if ((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_ALIGN)) {
          bVar4 = true;
          if (iVar2 == 0) {
            pAVar7 = prvTidyAttrGetById(node,TidyAttr_ALIGN);
            prvTidyReportAttrError(doc,node,pAVar7,0x255);
            if (node == pNVar6) goto LAB_00159c51;
            bVar4 = false;
            goto LAB_00159c0f;
          }
          break;
        }
      }
      if (node == pNVar6) {
        if (!bVar4) {
LAB_00159c51:
          lVar8 = 0;
          do {
            pAVar7 = prvTidyAttrGetById(node,*(TidyAttrId *)((long)BadBody5Attribs + lVar8));
            if (pAVar7 != (AttVal *)0x0) {
              prvTidyReportAttrError(doc,node,pAVar7,0x255);
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x18);
        }
      }
      else {
LAB_00159c0f:
        if (node->tag == (Dict *)0x0) {
LAB_00159cf6:
          BVar5 = prvTidynodeIsElement(node);
          if ((BVar5 != no) && (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) {
            if ((pDVar3->versions & 0x6e000) == 0) goto LAB_00159df2;
            lVar8 = 8;
            do {
              if (*(TidyTagId *)((long)&html5Info[0].tag + lVar8) == pDVar3->id) goto LAB_00159df2;
              lVar8 = lVar8 + 0x10;
            } while (lVar8 != 200);
          }
        }
        else {
          TVar9 = node->tag->id;
          if ((int)TVar9 < 0x24) {
            if ((int)TVar9 < 0xd) {
              if (TVar9 == TidyTag_ACRONYM) {
                if (iVar1 != 0) {
                  TVar9 = TidyTag_ABBR;
LAB_00159de3:
                  prvTidyCoerceNode(doc,node,TVar9,yes,no);
                  goto LAB_00159e0c;
                }
              }
              else if (TVar9 == TidyTag_APPLET) {
                if (iVar1 != 0) {
                  TVar9 = TidyTag_OBJECT;
                  goto LAB_00159de3;
                }
              }
              else if (TVar9 != TidyTag_BASEFONT) goto LAB_00159cf6;
            }
            else if (TVar9 == TidyTag_BIG) {
              if (iVar1 != 0) {
                property = "font-size: larger";
                goto LAB_00159dd3;
              }
            }
            else if ((TVar9 != TidyTag_CENTER) && (TVar9 != TidyTag_DIR)) goto LAB_00159cf6;
          }
          else if ((int)TVar9 < 0x48) {
            if ((1 < TVar9 - TidyTag_FRAME) && (TVar9 != TidyTag_FONT)) goto LAB_00159cf6;
          }
          else if (TVar9 != TidyTag_NOFRAMES) {
            if (TVar9 == TidyTag_STRIKE) {
              if (iVar1 != 0) {
                property = "text-decoration: line-through";
LAB_00159dd3:
                prvTidyAddStyleProperty(doc,node,property);
                TVar9 = TidyTag_SPAN;
                goto LAB_00159de3;
              }
            }
            else {
              if (TVar9 != TidyTag_TT) goto LAB_00159cf6;
              if (iVar1 != 0) {
                property = "font-family: monospace";
                goto LAB_00159dd3;
              }
            }
          }
LAB_00159df2:
          if (!bVar4) {
            prvTidyReport(doc,node,node,0x271);
          }
        }
      }
LAB_00159e0c:
      if (node->content != (Node *)0x0) {
        prvTidyCheckHTML5(doc,node->content);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(CheckHTML5)( TidyDocImpl* doc, Node* node )
{
    Bool clean = cfgBool( doc, TidyMakeClean );
    Bool already_strict = cfgBool( doc, TidyStrictTagsAttr );
    Node* body = TY_(FindBody)( doc );
    Bool warn = yes;    /* should this be a warning, error, or report??? */
    AttVal* attr = NULL;
    int i = 0;

    while (node)
    {
        if ( nodeHasAlignAttr( node ) ) {
            /* @todo: Is this for ALL elements that accept an 'align' attribute,
             * or should this be a sub-set test?
             */

            /* We will only emit this message if `--strict-tags-attributes==no`;
             * otherwise if yes this message will be output during later
             * checking.
             */
            if ( !already_strict )
                TY_(ReportAttrError)(doc, node, TY_(AttrGetById)(node, TidyAttr_ALIGN), MISMATCHED_ATTRIBUTE_WARN);
        }
        if ( node == body ) {
            i = 0;
            /* We will only emit these messages if `--strict-tags-attributes==no`;
             * otherwise if yes these messages will be output during later
             * checking.
             */
            if ( !already_strict ) {
                while ( BadBody5Attribs[i] != TidyAttr_UNKNOWN ) {
                    attr = TY_(AttrGetById)(node, BadBody5Attribs[i]);
                    if ( attr )
                        TY_(ReportAttrError)(doc, node, attr , MISMATCHED_ATTRIBUTE_WARN);
                    i++;
                }
            }
        } else
        if ( nodeIsACRONYM(node) ) {
            if (clean) {
                /* Replace with 'abbr' with warning to that effect.
                 * Maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_ABBR, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsAPPLET(node) ) {
            if (clean) {
                /* replace with 'object' with warning to that effect
                 * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_OBJECT, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsBASEFONT(node) ) {
            /* basefont: CSS equivalent 'font-size', 'font-family' and 'color' 
             * on body or class on each subsequent element.
             * Difficult - If it is the first body element, then could consider
             * adding that to the <body> as a whole, else could perhaps apply it
             * to all subsequent elements. But also in consideration is the fact
             * that it was NOT supported in many browsers.
             * - For now just report a warning
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsBIG(node) ) {
            /* big: CSS equivalent 'font-size:larger'
             * so could replace the <big> ... </big> with
             * <span style="font-size: larger"> ... </span>
             * then replace <big> with <span>
             * Need to think about that...
             * Could use -
             *   TY_(AddStyleProperty)( doc, node, "font-size: larger" );
             *   TY_(CoerceNode)(doc, node, TidyTag_SPAN, no, no);
             * Alternatively generated a <style> but how to get the style name
             * TY_(AddAttribute)( doc, node, "class", "????" );
             * Also maybe need a specific message like
             * Element '%s' replaced with 'span' with a 'font-size: larger style attribute
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-size: larger" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsCENTER(node) ) {
            /* center: CSS equivalent 'text-align:center'
             * and 'margin-left:auto; margin-right:auto' on descendant blocks
             * Tidy already handles this if 'clean' by SILENTLY generating the
             * <style> and adding a <div class="c1"> around the elements.
             * see: static Bool Center2Div( TidyDocImpl* doc, Node *node, Node **pnode)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsDIR(node) ) {
            /* dir: replace by <ul>
             * Tidy already actions this and issues a warning
             * Should this be CHANGED???
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsFONT(node) ) {
            /* Tidy already handles this -
             * If 'clean' replaced by CSS, else
             * if is NOT clean, and doctype html5 then warnings issued
             * done in Bool Font2Span( TidyDocImpl* doc, Node *node, Node **pnode ) (I think?)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if (( nodesIsFRAME(node) ) || ( nodeIsFRAMESET(node) ) || ( nodeIsNOFRAMES(node) )) {
            /* YOW: What to do here?????? Maybe <iframe>????
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsSTRIKE(node) ) {
            /* strike: CSS equivalent 'text-decoration:line-through'
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "text-decoration: line-through" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsTT(node) ) {
            /* tt: CSS equivalent 'font-family:monospace'
             * Tidy presently does nothing. Tidy5 issues a warning
             * But like the 'clean' <font> replacement this could also be replaced with CSS
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-family: monospace" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
            if (TY_(nodeIsElement)(node)) {
                if (node->tag) {
                    if ( (!(node->tag->versions & VERS_HTML5) && !(node->tag->versions & VERS_PROPRIETARY)) || (inRemovedInfo(node->tag->id)) ) {
                        if ( !already_strict )
                            TY_(Report)(doc, node, node, REMOVED_HTML5);
                    }
                }
            }

        if (node->content)
            TY_(CheckHTML5)( doc, node->content );
        
        node = node->next;
    }
}